

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O3

void __thiscall RTIMUMagCal::newEllipsoidData(RTIMUMagCal *this,RTVector3 *data)

{
  uint uVar1;
  uint uVar2;
  int i;
  int iVar3;
  long lVar4;
  int iVar5;
  RTVector3 calData;
  RTVector3 local_1c;
  
  RTVector3::RTVector3(&local_1c);
  lVar4 = 0;
  do {
    local_1c.m_data[lVar4] =
         (data->m_data[lVar4] - (this->m_minMaxOffset).m_data[lVar4]) *
         (this->m_minMaxScale).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  iVar3 = this->m_magCalCount;
  if (0 < iVar3) {
    iVar5 = this->m_magCalOutIndex;
    do {
      if (((ABS(local_1c.m_data[0] - (&this->m_magMax)[(long)iVar5 + 2].m_data[0]) < 0.1) &&
          (ABS(local_1c.m_data[1] - (&this->m_magMax)[(long)iVar5 + 2].m_data[1]) < 0.1)) &&
         (ABS(local_1c.m_data[2] - (&this->m_magMax)[(long)iVar5 + 2].m_data[2]) < 0.1)) {
        return;
      }
      iVar5 = iVar5 + 1;
      if (iVar5 == 20000) {
        iVar5 = 0;
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  uVar1 = (0.0 <= local_1c.m_data[0]) + 2;
  if (local_1c.m_data[1] < 0.0) {
    uVar1 = (uint)(0.0 <= local_1c.m_data[0]);
  }
  uVar2 = uVar1 + 4;
  if (local_1c.m_data[2] < 0.0) {
    uVar2 = uVar1;
  }
  this->m_octantCounts[uVar2] = this->m_octantCounts[uVar2] + 1;
  iVar3 = this->m_magCalInIndex;
  this->m_magCalInIndex = iVar3 + 1;
  RTVector3::operator=(&this->m_magMax + (long)iVar3 + 2,&local_1c);
  if (this->m_magCalInIndex == 20000) {
    this->m_magCalInIndex = 0;
  }
  iVar3 = this->m_magCalCount + 1;
  this->m_magCalCount = iVar3;
  if (iVar3 == 20000) {
    removeMagCalData(this);
  }
  return;
}

Assistant:

void RTIMUMagCal::newEllipsoidData(const RTVector3& data)
{
    RTVector3 calData;

    //  do min/max calibration first

    for (int i = 0; i < 3; i++)
        calData.setData(i, (data.data(i) - m_minMaxOffset.data(i)) * m_minMaxScale.data(i));

    //  now see if it's already there - we want them all unique and slightly separate (using a fuzzy compare)

    for (int index = m_magCalOutIndex, i = 0; i < m_magCalCount; i++) {
        if ((abs(calData.x() - m_magCalSamples[index].x()) < RTIMUCALDEFS_ELLIPSOID_MIN_SPACING) &&
            (abs(calData.y() - m_magCalSamples[index].y()) < RTIMUCALDEFS_ELLIPSOID_MIN_SPACING) &&
            (abs(calData.z() - m_magCalSamples[index].z()) < RTIMUCALDEFS_ELLIPSOID_MIN_SPACING)) {
                return;                                         // too close to another sample
        }
        if (++index == RTIMUCALDEFS_MAX_MAG_SAMPLES)
            index = 0;
    }


    m_octantCounts[findOctant(calData)]++;

    m_magCalSamples[m_magCalInIndex++] = calData;
    if (m_magCalInIndex == RTIMUCALDEFS_MAX_MAG_SAMPLES)
        m_magCalInIndex = 0;

    if (++m_magCalCount == RTIMUCALDEFS_MAX_MAG_SAMPLES) {
        // buffer is full - pull oldest
        removeMagCalData();
    }
}